

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O3

FT_Error tt_face_load_loca(TT_Face face,FT_Stream stream)

{
  ushort uVar1;
  bool bVar2;
  FT_Error FVar3;
  ulong in_RAX;
  ulong uVar4;
  FT_ULong FVar5;
  sbyte sVar6;
  ulong uVar7;
  long lVar8;
  TT_Table pTVar9;
  TT_Table pTVar10;
  ulong uVar11;
  FT_ULong local_38;
  FT_ULong table_len;
  
  local_38 = in_RAX;
  FVar3 = (*face->goto_table)(face,0x676c7966,stream,&face->glyf_len);
  if ((char)FVar3 == -0x72) {
    face->glyf_len = 0;
    face->glyf_offset = 0;
  }
  else {
    if (FVar3 != 0) {
      return FVar3;
    }
    if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
      FVar5 = FT_Stream_Pos(stream);
      face->glyf_offset = FVar5;
    }
    else {
      face->glyf_offset = 0;
    }
  }
  FVar3 = (*face->goto_table)(face,0x6c6f6361,stream,&local_38);
  if (FVar3 != 0) {
    return 0x90;
  }
  if ((face->header).Index_To_Loc_Format == 0) {
    if (0x1ffff < local_38) {
      local_38 = 0x1ffff;
    }
    uVar4 = local_38 >> 1;
    sVar6 = 1;
  }
  else {
    if (0x3ffff < local_38) {
      local_38 = 0x3ffff;
    }
    uVar4 = local_38 >> 2;
    sVar6 = 2;
  }
  face->num_locations = uVar4;
  uVar7 = (face->root).num_glyphs;
  uVar11 = uVar7 + 1;
  if (uVar7 < uVar4 || uVar4 == uVar11) goto LAB_0022ecb0;
  uVar11 = uVar11 << sVar6;
  pTVar9 = face->dir_tables;
  uVar1 = face->num_tables;
  FVar5 = FT_Stream_Pos(stream);
  if (uVar1 == 0) {
LAB_0022ec60:
    uVar4 = stream->size - FVar5;
  }
  else {
    pTVar10 = pTVar9 + uVar1;
    uVar4 = 0x7fffffff;
    bVar2 = false;
    do {
      uVar7 = pTVar9->Offset - FVar5;
      if (0 < (long)uVar7 && (long)uVar7 < (long)uVar4) {
        bVar2 = true;
        uVar4 = uVar7;
      }
      pTVar9 = pTVar9 + 1;
    } while (pTVar9 < pTVar10);
    if (!bVar2) goto LAB_0022ec60;
  }
  if (uVar4 < uVar11) {
    lVar8 = 0;
    if (face->num_locations != 0) {
      lVar8 = face->num_locations - 1;
    }
    (face->root).num_glyphs = lVar8;
  }
  else {
    face->num_locations = (face->root).num_glyphs + 1;
    local_38 = uVar11;
  }
LAB_0022ecb0:
  FVar3 = FT_Stream_ExtractFrame(stream,local_38,&face->glyph_locations);
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_loca( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error  error;
    FT_ULong  table_len;
    FT_Int    shift;


    /* we need the size of the `glyf' table for malformed `loca' tables */
    error = face->goto_table( face, TTAG_glyf, stream, &face->glyf_len );

    /* it is possible that a font doesn't have a glyf table at all */
    /* or its size is zero                                         */
    if ( FT_ERR_EQ( error, Table_Missing ) )
    {
      face->glyf_len    = 0;
      face->glyf_offset = 0;
    }
    else if ( error )
      goto Exit;
    else
    {
#ifdef FT_CONFIG_OPTION_INCREMENTAL
      if ( face->root.internal->incremental_interface )
        face->glyf_offset = 0;
      else
#endif
        face->glyf_offset = FT_STREAM_POS();
    }

    FT_TRACE2(( "Locations " ));
    error = face->goto_table( face, TTAG_loca, stream, &table_len );
    if ( error )
    {
      error = FT_THROW( Locations_Missing );
      goto Exit;
    }

    if ( face->header.Index_To_Loc_Format != 0 )
    {
      shift = 2;

      if ( table_len >= 0x40000L )
      {
        FT_TRACE2(( "table too large\n" ));
        table_len = 0x3FFFFL;
      }
      face->num_locations = table_len >> shift;
    }
    else
    {
      shift = 1;

      if ( table_len >= 0x20000L )
      {
        FT_TRACE2(( "table too large\n" ));
        table_len = 0x1FFFFL;
      }
      face->num_locations = table_len >> shift;
    }

    if ( face->num_locations != (FT_ULong)face->root.num_glyphs + 1 )
    {
      FT_TRACE2(( "glyph count mismatch!  loca: %d, maxp: %d\n",
                  face->num_locations - 1, face->root.num_glyphs ));

      /* we only handle the case where `maxp' gives a larger value */
      if ( face->num_locations <= (FT_ULong)face->root.num_glyphs )
      {
        FT_ULong  new_loca_len =
                    ( (FT_ULong)face->root.num_glyphs + 1 ) << shift;

        TT_Table  entry = face->dir_tables;
        TT_Table  limit = entry + face->num_tables;

        FT_Long  pos   = (FT_Long)FT_STREAM_POS();
        FT_Long  dist  = 0x7FFFFFFFL;
        FT_Bool  found = 0;


        /* compute the distance to next table in font file */
        for ( ; entry < limit; entry++ )
        {
          FT_Long  diff = (FT_Long)entry->Offset - pos;


          if ( diff > 0 && diff < dist )
          {
            dist  = diff;
            found = 1;
          }
        }

        if ( !found )
        {
          /* `loca' is the last table */
          dist = (FT_Long)stream->size - pos;
        }

        if ( new_loca_len <= (FT_ULong)dist )
        {
          face->num_locations = (FT_ULong)face->root.num_glyphs + 1;
          table_len           = new_loca_len;

          FT_TRACE2(( "adjusting num_locations to %d\n",
                      face->num_locations ));
        }
        else
        {
          face->root.num_glyphs = face->num_locations
                                    ? (FT_Long)face->num_locations - 1 : 0;

          FT_TRACE2(( "adjusting num_glyphs to %d\n",
                      face->root.num_glyphs ));
        }
      }
    }

    /*
     * Extract the frame.  We don't need to decompress it since
     * we are able to parse it directly.
     */
    if ( FT_FRAME_EXTRACT( table_len, face->glyph_locations ) )
      goto Exit;

    FT_TRACE2(( "loaded\n" ));

  Exit:
    return error;
  }